

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<pstore::repo::container<unsigned_char>,void>
               (container<unsigned_char> *container,ostream *os)

{
  iterator puVar1;
  uchar *elem;
  iterator __end0;
  iterator __begin0;
  container<unsigned_char> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  container<unsigned_char> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (container<unsigned_char> *)0x0;
  __end0 = pstore::repo::container<unsigned_char>::begin(container);
  puVar1 = pstore::repo::container<unsigned_char>::end(container);
  do {
    if (__end0 == puVar1) {
LAB_0012c5d7:
      if (__range3 != (container<unsigned_char> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((__range3 != (container<unsigned_char> *)0x0) &&
       (std::operator<<(os,','), __range3 == (container<unsigned_char> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_0012c5d7;
    }
    std::operator<<(os,' ');
    UniversalPrint<unsigned_char>(__end0,os);
    __range3 = (container<unsigned_char> *)((long)&__range3->begin_ + 1);
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }